

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O3

void StatsObserver::printStats(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  Player *pPVar6;
  bool bVar7;
  uint __val;
  uint uVar8;
  char cVar9;
  uint uVar10;
  GameLoop *pGVar11;
  long *plVar12;
  ostream *poVar13;
  ulong uVar14;
  size_type *psVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  pointer ppPVar19;
  uint __len;
  char cVar20;
  undefined1 auVar21 [16];
  string percentage;
  string currentPlayer;
  string __str_1;
  stringstream stream;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  double local_1c8;
  pointer local_1c0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  pGVar11 = GameLoop::getInstance();
  pvVar3 = pGVar11->gameMap->pMapCountries;
  ppCVar4 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar5 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pGVar11 = GameLoop::getInstance();
  ppPVar19 = (pGVar11->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_1c0 = (pGVar11->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl
              .super__Vector_impl_data._M_finish;
  if (ppPVar19 != local_1c0) {
    local_1c8 = (double)(int)((ulong)((long)ppCVar4 - (long)ppCVar5) >> 3);
    do {
      pPVar6 = *ppPVar19;
      if ((pPVar6->pOwnedCountries->
          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (pPVar6->pOwnedCountries->
          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar2 = *pPVar6->pPlayerId;
        __val = -uVar2;
        if (0 < (int)uVar2) {
          __val = uVar2;
        }
        __len = 1;
        if (9 < __val) {
          uVar14 = (ulong)__val;
          uVar8 = 4;
          do {
            __len = uVar8;
            uVar10 = (uint)uVar14;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_0011815c;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_0011815c;
            }
            if (uVar10 < 10000) goto LAB_0011815c;
            uVar14 = uVar14 / 10000;
            uVar8 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_0011815c:
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_228,(char)__len - (char)((int)uVar2 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_228._M_dataplus._M_p + (uVar2 >> 0x1f),__len,__val);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x12e535);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        psVar15 = (size_type *)(plVar12 + 2);
        paVar1 = &local_228.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_208.field_2._M_allocated_capacity = *psVar15;
          local_208.field_2._8_8_ = plVar12[3];
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar15;
          local_208._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_208._M_string_length = plVar12[1];
        *plVar12 = (long)psVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar1) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        lVar16 = (long)(pPVar6->pOwnedCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pPVar6->pOwnedCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        lVar17 = lVar16 >> 3;
        auVar21._8_4_ = (int)(lVar16 >> 0x23);
        auVar21._0_8_ = lVar17;
        auVar21._12_4_ = 0x45300000;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_248,vsnprintf,0x148,"%f",
                   (((auVar21._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) / local_1c8) *
                   100.0);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_248);
        psVar15 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_228.field_2._M_allocated_capacity = *psVar15;
          local_228.field_2._8_8_ = plVar12[3];
          local_228._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_228.field_2._M_allocated_capacity = *psVar15;
          local_228._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_228._M_string_length = plVar12[1];
        *plVar12 = (long)psVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        center(&local_248,&local_208,10);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_248._M_dataplus._M_p,
                             local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," | ",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        uVar14 = (long)(pPVar6->pOwnedCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pPVar6->pOwnedCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        cVar20 = '\x01';
        if (9 < uVar14) {
          uVar18 = uVar14;
          cVar9 = '\x04';
          do {
            cVar20 = cVar9;
            if (uVar18 < 100) {
              cVar20 = cVar20 + -2;
              goto LAB_00118393;
            }
            if (uVar18 < 1000) {
              cVar20 = cVar20 + -1;
              goto LAB_00118393;
            }
            if (uVar18 < 10000) goto LAB_00118393;
            bVar7 = 99999 < uVar18;
            uVar18 = uVar18 / 10000;
            cVar9 = cVar20 + '\x04';
          } while (bVar7);
          cVar20 = cVar20 + '\x01';
        }
LAB_00118393:
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_1e8,cVar20);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_1e8._M_dataplus._M_p,(uint)local_1e8._M_string_length,uVar14);
        center(&local_248,&local_1e8,0x14);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_248._M_dataplus._M_p,
                             local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," | ",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        center(&local_248,&local_228,0x14);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_248._M_dataplus._M_p,
                             local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar1) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      ppPVar19 = ppPVar19 + 1;
    } while (ppPVar19 != local_1c0);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void StatsObserver::printStats() {
    int numberOfCountries = GameLoop::getInstance()->getGameMap()->getMapCountries()->size();
    std::stringstream stream;

    for (auto* p : *GameLoop::getInstance()->getAllPlayers()) {
        if (!p->getOwnedCountries()->empty()) {
            std::string currentPlayer = "Player " + std::to_string(p->getPlayerId());
            std::string percentage = std::to_string(
                    static_cast<double>(p->getOwnedCountries()->size()) / static_cast<double>(numberOfCountries) * 100) + "%";
            std::cout << center(currentPlayer, 10) << " | ";
            std::cout << center(std::to_string(p->getOwnedCountries()->size()), 20) << " | ";
            std::cout << center(percentage, 20) << "\n";
        }
    }
}